

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_fma_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [24];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_rpow op;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_3ac4;
  int local_3a58;
  undefined8 *local_3a48;
  uint *local_3a40;
  undefined8 *local_3a38;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float local_3840;
  float fStack_383c;
  float fStack_3838;
  float fStack_3834;
  float fStack_3830;
  float fStack_382c;
  float fStack_3828;
  undefined4 uStack_3824;
  undefined1 local_3800 [8];
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined1 local_3760 [8];
  float fStack_3758;
  float fStack_3754;
  undefined1 local_3740 [8];
  float fStack_3738;
  float fStack_3734;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  float local_3700;
  float fStack_36fc;
  float fStack_36f8;
  float fStack_36f4;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float local_3640;
  float fStack_363c;
  float fStack_3638;
  float fStack_3634;
  undefined1 local_35a0 [8];
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined1 local_3520 [8];
  float fStack_3518;
  float fStack_3514;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined1 local_34a0 [8];
  float fStack_3498;
  float fStack_3494;
  float fStack_3490;
  float fStack_348c;
  float fStack_3488;
  float fStack_3484;
  float local_3480;
  float fStack_347c;
  float fStack_3478;
  float fStack_3474;
  float local_3440;
  float fStack_343c;
  float fStack_3438;
  float fStack_3434;
  float fStack_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float fStack_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float fStack_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  float local_32e0;
  float fStack_32dc;
  float fStack_32d8;
  float fStack_32d4;
  float local_2f00;
  float fStack_2efc;
  float fStack_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  float fStack_2ee4;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  undefined4 uStack_2164;
  undefined1 local_2140 [8];
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined1 local_20a0 [8];
  float fStack_2098;
  float fStack_2094;
  undefined1 local_2080 [8];
  float fStack_2078;
  float fStack_2074;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1e60 [8];
  float fStack_1e58;
  float fStack_1e54;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1de0 [8];
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined8 local_c40;
  undefined8 uStack_c38;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  
  local_3a48 = in_RDX;
  local_3a40 = in_RSI;
  local_3a38 = in_RDI;
  if (in_R8D == 8) {
    for (local_3a58 = 0; local_3a58 < in_ECX; local_3a58 = local_3a58 + 1) {
      uVar1 = *local_3a40;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_38f0 = auVar5._0_8_;
      uStack_38e8 = auVar5._8_8_;
      auVar115._16_8_ = uStack_38f0;
      auVar115._0_16_ = auVar4;
      auVar115._24_8_ = uStack_38e8;
      auVar114._16_8_ = uStack_38f0;
      auVar114._0_16_ = auVar4;
      auVar114._24_8_ = uStack_38e8;
      auVar3 = vcmpps_avx(auVar114,ZEXT1632(ZEXT816(0)),2);
      auVar7._8_8_ = 0x80000000800000;
      auVar7._0_8_ = 0x80000000800000;
      auVar7._16_8_ = 0x80000000800000;
      auVar7._24_8_ = 0x80000000800000;
      auVar6 = vmaxps_avx(auVar115,auVar7);
      auVar4 = vpsrld_avx(auVar6._0_16_,ZEXT416(0x17));
      auVar5 = vpsrld_avx(auVar6._16_16_,ZEXT416(0x17));
      auVar50._8_8_ = 0x807fffff807fffff;
      auVar50._0_8_ = 0x807fffff807fffff;
      auVar50._16_8_ = 0x807fffff807fffff;
      auVar50._24_8_ = 0x807fffff807fffff;
      auVar6 = vandps_avx(auVar6,auVar50);
      auVar72._8_8_ = 0x3f0000003f000000;
      auVar72._0_8_ = 0x3f0000003f000000;
      auVar72._16_8_ = 0x3f0000003f000000;
      auVar72._24_8_ = 0x3f0000003f000000;
      auVar7 = vorps_avx(auVar6,auVar72);
      auVar75._8_8_ = 0x7f0000007f;
      auVar75._0_8_ = 0x7f0000007f;
      auVar4 = vpsubd_avx(auVar4,auVar75);
      auVar74._8_8_ = 0x7f0000007f;
      auVar74._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar5,auVar74);
      local_c40 = auVar5._0_8_;
      uStack_c38 = auVar5._8_8_;
      auVar73._16_8_ = local_c40;
      auVar73._0_16_ = auVar4;
      auVar73._24_8_ = uStack_c38;
      auVar6 = vcvtdq2ps_avx(auVar73);
      local_1d20 = auVar6._0_4_;
      fStack_1d1c = auVar6._4_4_;
      fStack_1d18 = auVar6._8_4_;
      fStack_1d14 = auVar6._12_4_;
      fStack_1d10 = auVar6._16_4_;
      fStack_1d0c = auVar6._20_4_;
      fStack_1d08 = auVar6._24_4_;
      fStack_1d04 = auVar6._28_4_;
      local_1e60._4_4_ = fStack_1d1c + 1.0;
      local_1e60._0_4_ = local_1d20 + 1.0;
      fStack_1e58 = fStack_1d18 + 1.0;
      fStack_1e54 = fStack_1d14 + 1.0;
      uStack_1e50._0_4_ = fStack_1d10 + 1.0;
      uStack_1e50._4_4_ = fStack_1d0c + 1.0;
      uStack_1e48._0_4_ = fStack_1d08 + 1.0;
      uStack_1e48._4_4_ = fStack_1d04 + 1.0;
      auVar47 = _local_1e60;
      auVar121 = vcmpps_avx(auVar7,_DAT_01f8f6e0,1);
      auVar6 = vandps_avx(auVar7,auVar121);
      auVar48._8_8_ = 0x3f8000003f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar48._16_8_ = 0x3f8000003f800000;
      auVar48._24_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar7,auVar48);
      uStack_1e48 = auVar47._24_8_;
      auVar49._8_8_ = 0x3f8000003f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar49._16_8_ = 0x3f8000003f800000;
      auVar49._24_8_ = 0x3f8000003f800000;
      auVar121 = vandps_avx(auVar49,auVar121);
      auVar47._16_8_ = uStack_1e50;
      auVar47._0_16_ = _local_1e60;
      auVar47._24_8_ = uStack_1e48;
      auVar121 = vsubps_avx(auVar47,auVar121);
      local_1d60 = auVar7._0_4_;
      fStack_1d5c = auVar7._4_4_;
      fStack_1d58 = auVar7._8_4_;
      fStack_1d54 = auVar7._12_4_;
      fStack_1d50 = auVar7._16_4_;
      fStack_1d4c = auVar7._20_4_;
      fStack_1d48 = auVar7._24_4_;
      fStack_1d44 = auVar7._28_4_;
      local_1d80 = auVar6._0_4_;
      fStack_1d7c = auVar6._4_4_;
      fStack_1d78 = auVar6._8_4_;
      fStack_1d74 = auVar6._12_4_;
      fStack_1d70 = auVar6._16_4_;
      fStack_1d6c = auVar6._20_4_;
      fStack_1d68 = auVar6._24_4_;
      fStack_1d64 = auVar6._28_4_;
      local_1de0._0_4_ = local_1d60 + local_1d80;
      local_1de0._4_4_ = fStack_1d5c + fStack_1d7c;
      fStack_1dd8 = fStack_1d58 + fStack_1d78;
      fStack_1dd4 = fStack_1d54 + fStack_1d74;
      fStack_1dd0 = fStack_1d50 + fStack_1d70;
      fStack_1dcc = fStack_1d4c + fStack_1d6c;
      fStack_1dc8 = fStack_1d48 + fStack_1d68;
      fStack_1dc4 = fStack_1d44 + fStack_1d64;
      uStack_1ed8 = 0x3d9021bb3d9021bb;
      local_1ee0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_1ed0 = 0x3d9021bb3d9021bb;
      uStack_1ec8 = 0x3d9021bb3d9021bb;
      auVar59._8_4_ = -0.1151461;
      auVar59._12_4_ = -0.1151461;
      auVar59._0_4_ = -0.1151461;
      auVar59._4_4_ = -0.1151461;
      auVar59._16_4_ = -0.1151461;
      auVar59._20_4_ = -0.1151461;
      auVar59._24_4_ = -0.1151461;
      auVar59._28_4_ = -0.1151461;
      auVar4 = vfmadd213ps_fma(_local_1de0,_local_1ee0,auVar59);
      auVar60._8_4_ = 0.116769984;
      auVar60._12_4_ = 0.116769984;
      auVar60._0_4_ = 0.116769984;
      auVar60._4_4_ = 0.116769984;
      auVar60._16_4_ = 0.116769984;
      auVar60._20_4_ = 0.116769984;
      auVar60._24_4_ = 0.116769984;
      auVar60._28_4_ = 0.116769984;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar60);
      auVar61._8_4_ = -0.12420141;
      auVar61._12_4_ = -0.12420141;
      auVar61._0_4_ = -0.12420141;
      auVar61._4_4_ = -0.12420141;
      auVar61._16_4_ = -0.12420141;
      auVar61._20_4_ = -0.12420141;
      auVar61._24_4_ = -0.12420141;
      auVar61._28_4_ = -0.12420141;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar61);
      auVar62._8_4_ = 0.14249323;
      auVar62._12_4_ = 0.14249323;
      auVar62._0_4_ = 0.14249323;
      auVar62._4_4_ = 0.14249323;
      auVar62._16_4_ = 0.14249323;
      auVar62._20_4_ = 0.14249323;
      auVar62._24_4_ = 0.14249323;
      auVar62._28_4_ = 0.14249323;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar62);
      auVar63._8_4_ = -0.16668057;
      auVar63._12_4_ = -0.16668057;
      auVar63._0_4_ = -0.16668057;
      auVar63._4_4_ = -0.16668057;
      auVar63._16_4_ = -0.16668057;
      auVar63._20_4_ = -0.16668057;
      auVar63._24_4_ = -0.16668057;
      auVar63._28_4_ = -0.16668057;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar63);
      auVar64._8_4_ = 0.20000714;
      auVar64._12_4_ = 0.20000714;
      auVar64._0_4_ = 0.20000714;
      auVar64._4_4_ = 0.20000714;
      auVar64._16_4_ = 0.20000714;
      auVar64._20_4_ = 0.20000714;
      auVar64._24_4_ = 0.20000714;
      auVar64._28_4_ = 0.20000714;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar64);
      auVar65._8_4_ = -0.24999994;
      auVar65._12_4_ = -0.24999994;
      auVar65._0_4_ = -0.24999994;
      auVar65._4_4_ = -0.24999994;
      auVar65._16_4_ = -0.24999994;
      auVar65._20_4_ = -0.24999994;
      auVar65._24_4_ = -0.24999994;
      auVar65._28_4_ = -0.24999994;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar65);
      auVar66._8_4_ = 0.3333333;
      auVar66._12_4_ = 0.3333333;
      auVar66._0_4_ = 0.3333333;
      auVar66._4_4_ = 0.3333333;
      auVar66._16_4_ = 0.3333333;
      auVar66._20_4_ = 0.3333333;
      auVar66._24_4_ = 0.3333333;
      auVar66._28_4_ = 0.3333333;
      auVar4 = vfmadd213ps_fma(_local_1de0,ZEXT1632(auVar4),auVar66);
      local_1c20 = auVar4._0_4_;
      fStack_1c1c = auVar4._4_4_;
      fStack_1c18 = auVar4._8_4_;
      fStack_1c14 = auVar4._12_4_;
      local_1ee0._4_4_ =
           fStack_1c1c * (float)local_1de0._4_4_ * (float)local_1de0._4_4_ * (float)local_1de0._4_4_
      ;
      local_1ee0._0_4_ =
           local_1c20 * (float)local_1de0._0_4_ * (float)local_1de0._0_4_ * (float)local_1de0._0_4_;
      uStack_1ed8._0_4_ = fStack_1c18 * fStack_1dd8 * fStack_1dd8 * fStack_1dd8;
      uStack_1ed8._4_4_ = fStack_1c14 * fStack_1dd4 * fStack_1dd4 * fStack_1dd4;
      uStack_1ed0._0_4_ = fStack_1dd0 * 0.0 * fStack_1dd0 * fStack_1dd0;
      uStack_1ed0._4_4_ = fStack_1dcc * 0.0 * fStack_1dcc * fStack_1dcc;
      uStack_1ec8._0_4_ = fStack_1dc8 * 0.0 * fStack_1dc8 * fStack_1dc8;
      uStack_1ec8._4_4_ = 0;
      auVar67._8_4_ = -0.00021219444;
      auVar67._12_4_ = -0.00021219444;
      auVar67._0_4_ = -0.00021219444;
      auVar67._4_4_ = -0.00021219444;
      auVar67._16_4_ = -0.00021219444;
      auVar67._20_4_ = -0.00021219444;
      auVar67._24_4_ = -0.00021219444;
      auVar67._28_4_ = -0.00021219444;
      auVar4 = vfmadd213ps_fma(auVar67,auVar121,_local_1ee0);
      auVar117._4_4_ = (float)local_1de0._4_4_ * (float)local_1de0._4_4_;
      auVar117._0_4_ = (float)local_1de0._0_4_ * (float)local_1de0._0_4_;
      auVar117._8_4_ = fStack_1dd8 * fStack_1dd8;
      auVar117._12_4_ = fStack_1dd4 * fStack_1dd4;
      auVar117._16_4_ = fStack_1dd0 * fStack_1dd0;
      auVar117._20_4_ = fStack_1dcc * fStack_1dcc;
      auVar117._24_4_ = fStack_1dc8 * fStack_1dc8;
      auVar117._28_4_ = fStack_1dc4;
      auVar71._8_4_ = 0.5;
      auVar71._12_4_ = 0.5;
      auVar71._0_4_ = 0.5;
      auVar71._4_4_ = 0.5;
      auVar71._16_4_ = 0.5;
      auVar71._20_4_ = 0.5;
      auVar71._24_4_ = 0.5;
      auVar71._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar71,auVar117,ZEXT1632(auVar4));
      local_1dc0 = auVar4._0_4_;
      fStack_1dbc = auVar4._4_4_;
      fStack_1db8 = auVar4._8_4_;
      fStack_1db4 = auVar4._12_4_;
      local_1de0._4_4_ = (float)local_1de0._4_4_ + fStack_1dbc;
      local_1de0._0_4_ = (float)local_1de0._0_4_ + local_1dc0;
      fStack_1dd8 = fStack_1dd8 + fStack_1db8;
      fStack_1dd4 = fStack_1dd4 + fStack_1db4;
      fStack_1dd0 = fStack_1dd0 + 0.0;
      fStack_1dcc = fStack_1dcc + 0.0;
      fStack_1dc8 = fStack_1dc8 + 0.0;
      fStack_1dc4 = fStack_1dc4 + 0.0;
      auVar68._8_4_ = 0.6933594;
      auVar68._12_4_ = 0.6933594;
      auVar68._0_4_ = 0.6933594;
      auVar68._4_4_ = 0.6933594;
      auVar68._16_4_ = 0.6933594;
      auVar68._20_4_ = 0.6933594;
      auVar68._24_4_ = 0.6933594;
      auVar68._28_4_ = 0.6933594;
      auVar4 = vfmadd213ps_fma(auVar68,auVar121,_local_1de0);
      auVar6 = vorps_avx(ZEXT1632(auVar4),auVar3);
      local_2180 = (float)*local_3a38;
      fStack_217c = (float)((ulong)*local_3a38 >> 0x20);
      fStack_2178 = (float)local_3a38[1];
      fStack_2174 = (float)((ulong)local_3a38[1] >> 0x20);
      fStack_2170 = (float)local_3a38[2];
      fStack_216c = (float)((ulong)local_3a38[2] >> 0x20);
      fStack_2168 = (float)local_3a38[3];
      uStack_2164 = (undefined4)((ulong)local_3a38[3] >> 0x20);
      local_21a0 = auVar6._0_4_;
      fStack_219c = auVar6._4_4_;
      fStack_2198 = auVar6._8_4_;
      fStack_2194 = auVar6._12_4_;
      fStack_2190 = auVar6._16_4_;
      fStack_218c = auVar6._20_4_;
      fStack_2188 = auVar6._24_4_;
      local_2080._4_4_ = fStack_217c * fStack_219c;
      local_2080._0_4_ = local_2180 * local_21a0;
      fStack_2078 = fStack_2178 * fStack_2198;
      fStack_2074 = fStack_2174 * fStack_2194;
      uStack_2070._0_4_ = fStack_2170 * fStack_2190;
      uStack_2070._4_4_ = fStack_216c * fStack_218c;
      uStack_2068._0_4_ = fStack_2168 * fStack_2188;
      uStack_2068._4_4_ = uStack_2164;
      auVar6 = _local_2080;
      uStack_2068 = auVar6._24_8_;
      auVar3._16_8_ = uStack_2070;
      auVar3._0_16_ = _local_2080;
      auVar3._24_8_ = uStack_2068;
      auVar6._8_8_ = 0x42b0c0a542b0c0a5;
      auVar6._0_8_ = 0x42b0c0a542b0c0a5;
      auVar6._16_8_ = 0x42b0c0a542b0c0a5;
      auVar6._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar3,auVar6);
      auVar121._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121 = vmaxps_avx(auVar6,auVar121);
      auVar53._8_4_ = 1.442695;
      auVar53._12_4_ = 1.442695;
      auVar53._0_4_ = 1.442695;
      auVar53._4_4_ = 1.442695;
      auVar53._16_4_ = 1.442695;
      auVar53._20_4_ = 1.442695;
      auVar53._24_4_ = 1.442695;
      auVar53._28_4_ = 1.442695;
      auVar52._8_4_ = 0.5;
      auVar52._12_4_ = 0.5;
      auVar52._0_4_ = 0.5;
      auVar52._4_4_ = 0.5;
      auVar52._16_4_ = 0.5;
      auVar52._20_4_ = 0.5;
      auVar52._24_4_ = 0.5;
      auVar52._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar53,auVar121,auVar52);
      auVar3 = vroundps_avx(ZEXT1632(auVar4),1);
      auVar6 = vcmpps_avx(ZEXT1632(auVar4),auVar3,1);
      auVar51._8_8_ = 0x3f8000003f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._16_8_ = 0x3f8000003f800000;
      auVar51._24_8_ = 0x3f8000003f800000;
      auVar6 = vandps_avx(auVar6,auVar51);
      auVar6 = vsubps_avx(auVar3,auVar6);
      auVar69._8_4_ = 0.6933594;
      auVar69._12_4_ = 0.6933594;
      auVar69._0_4_ = 0.6933594;
      auVar69._4_4_ = 0.6933594;
      auVar69._16_4_ = 0.6933594;
      auVar69._20_4_ = 0.6933594;
      auVar69._24_4_ = 0.6933594;
      auVar69._28_4_ = 0.6933594;
      auVar4 = vfnmadd213ps_fma(auVar69,auVar6,auVar121);
      auVar70._8_4_ = -0.00021219444;
      auVar70._12_4_ = -0.00021219444;
      auVar70._0_4_ = -0.00021219444;
      auVar70._4_4_ = -0.00021219444;
      auVar70._16_4_ = -0.00021219444;
      auVar70._20_4_ = -0.00021219444;
      auVar70._24_4_ = -0.00021219444;
      auVar70._28_4_ = -0.00021219444;
      auVar4 = vfnmadd213ps_fma(auVar70,auVar6,ZEXT1632(auVar4));
      auVar121 = ZEXT1632(auVar4);
      local_1f80 = auVar4._0_4_;
      fStack_1f7c = auVar4._4_4_;
      fStack_1f78 = auVar4._8_4_;
      fStack_1f74 = auVar4._12_4_;
      _local_20a0 = ZEXT1632(CONCAT412(fStack_1f74 * fStack_1f74,
                                       CONCAT48(fStack_1f78 * fStack_1f78,
                                                CONCAT44(fStack_1f7c * fStack_1f7c,
                                                         local_1f80 * local_1f80))));
      uStack_2138 = 0x3950696739506967;
      local_2140 = (undefined1  [8])0x3950696739506967;
      uStack_2130 = 0x3950696739506967;
      uStack_2128 = 0x3950696739506967;
      auVar54._8_4_ = 0.0013981999;
      auVar54._12_4_ = 0.0013981999;
      auVar54._0_4_ = 0.0013981999;
      auVar54._4_4_ = 0.0013981999;
      auVar54._16_4_ = 0.0013981999;
      auVar54._20_4_ = 0.0013981999;
      auVar54._24_4_ = 0.0013981999;
      auVar54._28_4_ = 0.0013981999;
      auVar4 = vfmadd213ps_fma(auVar121,_local_2140,auVar54);
      auVar55._8_4_ = 0.008333452;
      auVar55._12_4_ = 0.008333452;
      auVar55._0_4_ = 0.008333452;
      auVar55._4_4_ = 0.008333452;
      auVar55._16_4_ = 0.008333452;
      auVar55._20_4_ = 0.008333452;
      auVar55._24_4_ = 0.008333452;
      auVar55._28_4_ = 0.008333452;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar55);
      auVar56._8_4_ = 0.041665796;
      auVar56._12_4_ = 0.041665796;
      auVar56._0_4_ = 0.041665796;
      auVar56._4_4_ = 0.041665796;
      auVar56._16_4_ = 0.041665796;
      auVar56._20_4_ = 0.041665796;
      auVar56._24_4_ = 0.041665796;
      auVar56._28_4_ = 0.041665796;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar56);
      auVar57._8_4_ = 0.16666666;
      auVar57._12_4_ = 0.16666666;
      auVar57._0_4_ = 0.16666666;
      auVar57._4_4_ = 0.16666666;
      auVar57._16_4_ = 0.16666666;
      auVar57._20_4_ = 0.16666666;
      auVar57._24_4_ = 0.16666666;
      auVar57._28_4_ = 0.16666666;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar57);
      auVar58._8_4_ = 0.5;
      auVar58._12_4_ = 0.5;
      auVar58._0_4_ = 0.5;
      auVar58._4_4_ = 0.5;
      auVar58._16_4_ = 0.5;
      auVar58._20_4_ = 0.5;
      auVar58._24_4_ = 0.5;
      auVar58._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar58);
      auVar4 = vfmadd213ps_fma(_local_20a0,ZEXT1632(auVar4),auVar121);
      local_2040 = auVar4._0_4_;
      fStack_203c = auVar4._4_4_;
      fStack_2038 = auVar4._8_4_;
      fStack_2034 = auVar4._12_4_;
      local_1840 = auVar6._0_4_;
      fStack_183c = auVar6._4_4_;
      fStack_1838 = auVar6._8_4_;
      fStack_1834 = auVar6._12_4_;
      fStack_1830 = auVar6._16_4_;
      fStack_182c = auVar6._20_4_;
      fStack_1828 = auVar6._24_4_;
      fStack_1824 = auVar6._28_4_;
      local_20e0 = CONCAT44((int)fStack_183c,(int)local_1840);
      uStack_20d8 = CONCAT44((int)fStack_1834,(int)fStack_1838);
      uStack_20d0 = CONCAT44((int)fStack_182c,(int)fStack_1830);
      uStack_20c8 = CONCAT44((int)fStack_1824,(int)fStack_1828);
      auVar8._8_8_ = uStack_20d8;
      auVar8._0_8_ = local_20e0;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar8,auVar4);
      auVar9._8_8_ = uStack_20c8;
      auVar9._0_8_ = uStack_20d0;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar9,auVar5);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_1fe0 = auVar4._0_4_;
      fStack_1fdc = auVar4._4_4_;
      fStack_1fd8 = auVar4._8_4_;
      fStack_1fd4 = auVar4._12_4_;
      fStack_1fd0 = auVar5._0_4_;
      fStack_1fcc = auVar5._4_4_;
      fStack_1fc8 = auVar5._8_4_;
      local_2140._4_4_ = (fStack_203c + 1.0) * fStack_1fdc;
      local_2140._0_4_ = (local_2040 + 1.0) * local_1fe0;
      uStack_2138._0_4_ = (fStack_2038 + 1.0) * fStack_1fd8;
      uStack_2138._4_4_ = (fStack_2034 + 1.0) * fStack_1fd4;
      uStack_2130._0_4_ = fStack_1fd0 * 1.0;
      uStack_2130._4_4_ = fStack_1fcc * 1.0;
      auVar119 = _local_2140;
      uStack_2128._0_4_ = fStack_1fc8 * 1.0;
      uStack_2128._4_4_ = 0x3f800000;
      auVar6 = _local_2140;
      uStack_2130 = auVar119._16_8_;
      uStack_2128 = auVar6._24_8_;
      *local_3a48 = local_2140;
      local_3a48[1] = uStack_2138;
      local_3a48[2] = uStack_2130;
      local_3a48[3] = uStack_2128;
      local_3a38 = local_3a38 + 4;
      local_3a40 = local_3a40 + 1;
      local_3a48 = local_3a48 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_3ac4 = 0; local_3ac4 + 1 < in_ECX; local_3ac4 = local_3ac4 + 2) {
      uVar1 = *local_3a40;
      uVar2 = local_3a40[1];
      auVar113._8_8_ = CONCAT44(uVar1,uVar1);
      auVar113._0_8_ = CONCAT44(uVar1,uVar1);
      auVar113._16_8_ = CONCAT44(uVar2,uVar2);
      auVar113._24_8_ = CONCAT44(uVar2,uVar2);
      auVar112._8_8_ = CONCAT44(uVar1,uVar1);
      auVar112._0_8_ = CONCAT44(uVar1,uVar1);
      auVar112._16_8_ = CONCAT44(uVar2,uVar2);
      auVar112._24_8_ = CONCAT44(uVar2,uVar2);
      auVar3 = vcmpps_avx(auVar112,ZEXT1632(ZEXT816(0)),2);
      auVar15._8_8_ = 0x80000000800000;
      auVar15._0_8_ = 0x80000000800000;
      auVar15._16_8_ = 0x80000000800000;
      auVar15._24_8_ = 0x80000000800000;
      auVar6 = vmaxps_avx(auVar113,auVar15);
      auVar4 = vpsrld_avx(auVar6._0_16_,ZEXT416(0x17));
      auVar5 = vpsrld_avx(auVar6._16_16_,ZEXT416(0x17));
      auVar17._8_8_ = 0x807fffff807fffff;
      auVar17._0_8_ = 0x807fffff807fffff;
      auVar17._16_8_ = 0x807fffff807fffff;
      auVar17._24_8_ = 0x807fffff807fffff;
      auVar6 = vandps_avx(auVar6,auVar17);
      auVar43._8_8_ = 0x3f0000003f000000;
      auVar43._0_8_ = 0x3f0000003f000000;
      auVar43._16_8_ = 0x3f0000003f000000;
      auVar43._24_8_ = 0x3f0000003f000000;
      auVar7 = vorps_avx(auVar6,auVar43);
      auVar46._8_8_ = 0x7f0000007f;
      auVar46._0_8_ = 0x7f0000007f;
      auVar4 = vpsubd_avx(auVar4,auVar46);
      auVar45._8_8_ = 0x7f0000007f;
      auVar45._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar5,auVar45);
      local_2300 = auVar5._0_8_;
      uStack_22f8 = auVar5._8_8_;
      auVar44._16_8_ = local_2300;
      auVar44._0_16_ = auVar4;
      auVar44._24_8_ = uStack_22f8;
      auVar6 = vcvtdq2ps_avx(auVar44);
      local_33e0 = auVar6._0_4_;
      fStack_33dc = auVar6._4_4_;
      fStack_33d8 = auVar6._8_4_;
      fStack_33d4 = auVar6._12_4_;
      fStack_33d0 = auVar6._16_4_;
      fStack_33cc = auVar6._20_4_;
      fStack_33c8 = auVar6._24_4_;
      fStack_33c4 = auVar6._28_4_;
      local_3520._4_4_ = fStack_33dc + 1.0;
      local_3520._0_4_ = local_33e0 + 1.0;
      fStack_3518 = fStack_33d8 + 1.0;
      fStack_3514 = fStack_33d4 + 1.0;
      uStack_3510._0_4_ = fStack_33d0 + 1.0;
      uStack_3510._4_4_ = fStack_33cc + 1.0;
      uStack_3508._0_4_ = fStack_33c8 + 1.0;
      uStack_3508._4_4_ = fStack_33c4 + 1.0;
      auVar47 = _local_3520;
      auVar121 = vcmpps_avx(auVar7,_DAT_01f8f6e0,1);
      auVar6 = vandps_avx(auVar7,auVar121);
      auVar14._8_8_ = 0x3f8000003f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._16_8_ = 0x3f8000003f800000;
      auVar14._24_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar7,auVar14);
      uStack_3508 = auVar47._24_8_;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._16_8_ = 0x3f8000003f800000;
      auVar16._24_8_ = 0x3f8000003f800000;
      auVar121 = vandps_avx(auVar16,auVar121);
      auVar13._16_8_ = uStack_3510;
      auVar13._0_16_ = _local_3520;
      auVar13._24_8_ = uStack_3508;
      auVar121 = vsubps_avx(auVar13,auVar121);
      local_3420 = auVar7._0_4_;
      fStack_341c = auVar7._4_4_;
      fStack_3418 = auVar7._8_4_;
      fStack_3414 = auVar7._12_4_;
      fStack_3410 = auVar7._16_4_;
      fStack_340c = auVar7._20_4_;
      fStack_3408 = auVar7._24_4_;
      fStack_3404 = auVar7._28_4_;
      local_3440 = auVar6._0_4_;
      fStack_343c = auVar6._4_4_;
      fStack_3438 = auVar6._8_4_;
      fStack_3434 = auVar6._12_4_;
      fStack_3430 = auVar6._16_4_;
      fStack_342c = auVar6._20_4_;
      fStack_3428 = auVar6._24_4_;
      fStack_3424 = auVar6._28_4_;
      local_34a0._0_4_ = local_3420 + local_3440;
      local_34a0._4_4_ = fStack_341c + fStack_343c;
      fStack_3498 = fStack_3418 + fStack_3438;
      fStack_3494 = fStack_3414 + fStack_3434;
      fStack_3490 = fStack_3410 + fStack_3430;
      fStack_348c = fStack_340c + fStack_342c;
      fStack_3488 = fStack_3408 + fStack_3428;
      fStack_3484 = fStack_3404 + fStack_3424;
      uStack_3598 = 0x3d9021bb3d9021bb;
      local_35a0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3590 = 0x3d9021bb3d9021bb;
      uStack_3588 = 0x3d9021bb3d9021bb;
      auVar26._8_4_ = -0.1151461;
      auVar26._12_4_ = -0.1151461;
      auVar26._0_4_ = -0.1151461;
      auVar26._4_4_ = -0.1151461;
      auVar26._16_4_ = -0.1151461;
      auVar26._20_4_ = -0.1151461;
      auVar26._24_4_ = -0.1151461;
      auVar26._28_4_ = -0.1151461;
      auVar4 = vfmadd213ps_fma(_local_34a0,_local_35a0,auVar26);
      auVar27._8_4_ = 0.116769984;
      auVar27._12_4_ = 0.116769984;
      auVar27._0_4_ = 0.116769984;
      auVar27._4_4_ = 0.116769984;
      auVar27._16_4_ = 0.116769984;
      auVar27._20_4_ = 0.116769984;
      auVar27._24_4_ = 0.116769984;
      auVar27._28_4_ = 0.116769984;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar27);
      auVar28._8_4_ = -0.12420141;
      auVar28._12_4_ = -0.12420141;
      auVar28._0_4_ = -0.12420141;
      auVar28._4_4_ = -0.12420141;
      auVar28._16_4_ = -0.12420141;
      auVar28._20_4_ = -0.12420141;
      auVar28._24_4_ = -0.12420141;
      auVar28._28_4_ = -0.12420141;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar28);
      auVar29._8_4_ = 0.14249323;
      auVar29._12_4_ = 0.14249323;
      auVar29._0_4_ = 0.14249323;
      auVar29._4_4_ = 0.14249323;
      auVar29._16_4_ = 0.14249323;
      auVar29._20_4_ = 0.14249323;
      auVar29._24_4_ = 0.14249323;
      auVar29._28_4_ = 0.14249323;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar29);
      auVar30._8_4_ = -0.16668057;
      auVar30._12_4_ = -0.16668057;
      auVar30._0_4_ = -0.16668057;
      auVar30._4_4_ = -0.16668057;
      auVar30._16_4_ = -0.16668057;
      auVar30._20_4_ = -0.16668057;
      auVar30._24_4_ = -0.16668057;
      auVar30._28_4_ = -0.16668057;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar30);
      auVar31._8_4_ = 0.20000714;
      auVar31._12_4_ = 0.20000714;
      auVar31._0_4_ = 0.20000714;
      auVar31._4_4_ = 0.20000714;
      auVar31._16_4_ = 0.20000714;
      auVar31._20_4_ = 0.20000714;
      auVar31._24_4_ = 0.20000714;
      auVar31._28_4_ = 0.20000714;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar31);
      auVar32._8_4_ = -0.24999994;
      auVar32._12_4_ = -0.24999994;
      auVar32._0_4_ = -0.24999994;
      auVar32._4_4_ = -0.24999994;
      auVar32._16_4_ = -0.24999994;
      auVar32._20_4_ = -0.24999994;
      auVar32._24_4_ = -0.24999994;
      auVar32._28_4_ = -0.24999994;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar32);
      auVar33._8_4_ = 0.3333333;
      auVar33._12_4_ = 0.3333333;
      auVar33._0_4_ = 0.3333333;
      auVar33._4_4_ = 0.3333333;
      auVar33._16_4_ = 0.3333333;
      auVar33._20_4_ = 0.3333333;
      auVar33._24_4_ = 0.3333333;
      auVar33._28_4_ = 0.3333333;
      auVar4 = vfmadd213ps_fma(_local_34a0,ZEXT1632(auVar4),auVar33);
      local_32e0 = auVar4._0_4_;
      fStack_32dc = auVar4._4_4_;
      fStack_32d8 = auVar4._8_4_;
      fStack_32d4 = auVar4._12_4_;
      local_35a0._4_4_ =
           fStack_32dc * (float)local_34a0._4_4_ * (float)local_34a0._4_4_ * (float)local_34a0._4_4_
      ;
      local_35a0._0_4_ =
           local_32e0 * (float)local_34a0._0_4_ * (float)local_34a0._0_4_ * (float)local_34a0._0_4_;
      uStack_3598._0_4_ = fStack_32d8 * fStack_3498 * fStack_3498 * fStack_3498;
      uStack_3598._4_4_ = fStack_32d4 * fStack_3494 * fStack_3494 * fStack_3494;
      uStack_3590._0_4_ = fStack_3490 * 0.0 * fStack_3490 * fStack_3490;
      uStack_3590._4_4_ = fStack_348c * 0.0 * fStack_348c * fStack_348c;
      uStack_3588._0_4_ = fStack_3488 * 0.0 * fStack_3488 * fStack_3488;
      uStack_3588._4_4_ = 0;
      auVar34._8_4_ = -0.00021219444;
      auVar34._12_4_ = -0.00021219444;
      auVar34._0_4_ = -0.00021219444;
      auVar34._4_4_ = -0.00021219444;
      auVar34._16_4_ = -0.00021219444;
      auVar34._20_4_ = -0.00021219444;
      auVar34._24_4_ = -0.00021219444;
      auVar34._28_4_ = -0.00021219444;
      auVar4 = vfmadd213ps_fma(auVar34,auVar121,_local_35a0);
      auVar116._4_4_ = (float)local_34a0._4_4_ * (float)local_34a0._4_4_;
      auVar116._0_4_ = (float)local_34a0._0_4_ * (float)local_34a0._0_4_;
      auVar116._8_4_ = fStack_3498 * fStack_3498;
      auVar116._12_4_ = fStack_3494 * fStack_3494;
      auVar116._16_4_ = fStack_3490 * fStack_3490;
      auVar116._20_4_ = fStack_348c * fStack_348c;
      auVar116._24_4_ = fStack_3488 * fStack_3488;
      auVar116._28_4_ = fStack_3484;
      auVar38._8_4_ = 0.5;
      auVar38._12_4_ = 0.5;
      auVar38._0_4_ = 0.5;
      auVar38._4_4_ = 0.5;
      auVar38._16_4_ = 0.5;
      auVar38._20_4_ = 0.5;
      auVar38._24_4_ = 0.5;
      auVar38._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar38,auVar116,ZEXT1632(auVar4));
      local_3480 = auVar4._0_4_;
      fStack_347c = auVar4._4_4_;
      fStack_3478 = auVar4._8_4_;
      fStack_3474 = auVar4._12_4_;
      local_34a0._4_4_ = (float)local_34a0._4_4_ + fStack_347c;
      local_34a0._0_4_ = (float)local_34a0._0_4_ + local_3480;
      fStack_3498 = fStack_3498 + fStack_3478;
      fStack_3494 = fStack_3494 + fStack_3474;
      fStack_3490 = fStack_3490 + 0.0;
      fStack_348c = fStack_348c + 0.0;
      fStack_3488 = fStack_3488 + 0.0;
      fStack_3484 = fStack_3484 + 0.0;
      auVar35._8_4_ = 0.6933594;
      auVar35._12_4_ = 0.6933594;
      auVar35._0_4_ = 0.6933594;
      auVar35._4_4_ = 0.6933594;
      auVar35._16_4_ = 0.6933594;
      auVar35._20_4_ = 0.6933594;
      auVar35._24_4_ = 0.6933594;
      auVar35._28_4_ = 0.6933594;
      auVar4 = vfmadd213ps_fma(auVar35,auVar121,_local_34a0);
      auVar6 = vorps_avx(ZEXT1632(auVar4),auVar3);
      local_3840 = (float)*local_3a38;
      fStack_383c = (float)((ulong)*local_3a38 >> 0x20);
      fStack_3838 = (float)local_3a38[1];
      fStack_3834 = (float)((ulong)local_3a38[1] >> 0x20);
      fStack_3830 = (float)local_3a38[2];
      fStack_382c = (float)((ulong)local_3a38[2] >> 0x20);
      fStack_3828 = (float)local_3a38[3];
      uStack_3824 = (undefined4)((ulong)local_3a38[3] >> 0x20);
      local_3860 = auVar6._0_4_;
      fStack_385c = auVar6._4_4_;
      fStack_3858 = auVar6._8_4_;
      fStack_3854 = auVar6._12_4_;
      fStack_3850 = auVar6._16_4_;
      fStack_384c = auVar6._20_4_;
      fStack_3848 = auVar6._24_4_;
      local_3740._4_4_ = fStack_383c * fStack_385c;
      local_3740._0_4_ = local_3840 * local_3860;
      fStack_3738 = fStack_3838 * fStack_3858;
      fStack_3734 = fStack_3834 * fStack_3854;
      uStack_3730._0_4_ = fStack_3830 * fStack_3850;
      uStack_3730._4_4_ = fStack_382c * fStack_384c;
      uStack_3728._0_4_ = fStack_3828 * fStack_3848;
      uStack_3728._4_4_ = uStack_3824;
      auVar6 = _local_3740;
      uStack_3728 = auVar6._24_8_;
      auVar12._16_8_ = uStack_3730;
      auVar12._0_16_ = _local_3740;
      auVar12._24_8_ = uStack_3728;
      auVar11._8_8_ = 0x42b0c0a542b0c0a5;
      auVar11._0_8_ = 0x42b0c0a542b0c0a5;
      auVar11._16_8_ = 0x42b0c0a542b0c0a5;
      auVar11._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar12,auVar11);
      auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar10._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar10._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121 = vmaxps_avx(auVar6,auVar10);
      auVar20._8_4_ = 1.442695;
      auVar20._12_4_ = 1.442695;
      auVar20._0_4_ = 1.442695;
      auVar20._4_4_ = 1.442695;
      auVar20._16_4_ = 1.442695;
      auVar20._20_4_ = 1.442695;
      auVar20._24_4_ = 1.442695;
      auVar20._28_4_ = 1.442695;
      auVar19._8_4_ = 0.5;
      auVar19._12_4_ = 0.5;
      auVar19._0_4_ = 0.5;
      auVar19._4_4_ = 0.5;
      auVar19._16_4_ = 0.5;
      auVar19._20_4_ = 0.5;
      auVar19._24_4_ = 0.5;
      auVar19._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar20,auVar121,auVar19);
      auVar3 = vroundps_avx(ZEXT1632(auVar4),1);
      auVar6 = vcmpps_avx(ZEXT1632(auVar4),auVar3,1);
      auVar18._8_8_ = 0x3f8000003f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._16_8_ = 0x3f8000003f800000;
      auVar18._24_8_ = 0x3f8000003f800000;
      auVar6 = vandps_avx(auVar6,auVar18);
      auVar6 = vsubps_avx(auVar3,auVar6);
      auVar36._8_4_ = 0.6933594;
      auVar36._12_4_ = 0.6933594;
      auVar36._0_4_ = 0.6933594;
      auVar36._4_4_ = 0.6933594;
      auVar36._16_4_ = 0.6933594;
      auVar36._20_4_ = 0.6933594;
      auVar36._24_4_ = 0.6933594;
      auVar36._28_4_ = 0.6933594;
      auVar4 = vfnmadd213ps_fma(auVar36,auVar6,auVar121);
      auVar37._8_4_ = -0.00021219444;
      auVar37._12_4_ = -0.00021219444;
      auVar37._0_4_ = -0.00021219444;
      auVar37._4_4_ = -0.00021219444;
      auVar37._16_4_ = -0.00021219444;
      auVar37._20_4_ = -0.00021219444;
      auVar37._24_4_ = -0.00021219444;
      auVar37._28_4_ = -0.00021219444;
      auVar4 = vfnmadd213ps_fma(auVar37,auVar6,ZEXT1632(auVar4));
      auVar121 = ZEXT1632(auVar4);
      local_3640 = auVar4._0_4_;
      fStack_363c = auVar4._4_4_;
      fStack_3638 = auVar4._8_4_;
      fStack_3634 = auVar4._12_4_;
      _local_3760 = ZEXT1632(CONCAT412(fStack_3634 * fStack_3634,
                                       CONCAT48(fStack_3638 * fStack_3638,
                                                CONCAT44(fStack_363c * fStack_363c,
                                                         local_3640 * local_3640))));
      uStack_37f8 = 0x3950696739506967;
      local_3800 = (undefined1  [8])0x3950696739506967;
      uStack_37f0 = 0x3950696739506967;
      uStack_37e8 = 0x3950696739506967;
      auVar21._8_4_ = 0.0013981999;
      auVar21._12_4_ = 0.0013981999;
      auVar21._0_4_ = 0.0013981999;
      auVar21._4_4_ = 0.0013981999;
      auVar21._16_4_ = 0.0013981999;
      auVar21._20_4_ = 0.0013981999;
      auVar21._24_4_ = 0.0013981999;
      auVar21._28_4_ = 0.0013981999;
      auVar4 = vfmadd213ps_fma(auVar121,_local_3800,auVar21);
      auVar22._8_4_ = 0.008333452;
      auVar22._12_4_ = 0.008333452;
      auVar22._0_4_ = 0.008333452;
      auVar22._4_4_ = 0.008333452;
      auVar22._16_4_ = 0.008333452;
      auVar22._20_4_ = 0.008333452;
      auVar22._24_4_ = 0.008333452;
      auVar22._28_4_ = 0.008333452;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar22);
      auVar23._8_4_ = 0.041665796;
      auVar23._12_4_ = 0.041665796;
      auVar23._0_4_ = 0.041665796;
      auVar23._4_4_ = 0.041665796;
      auVar23._16_4_ = 0.041665796;
      auVar23._20_4_ = 0.041665796;
      auVar23._24_4_ = 0.041665796;
      auVar23._28_4_ = 0.041665796;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar23);
      auVar24._8_4_ = 0.16666666;
      auVar24._12_4_ = 0.16666666;
      auVar24._0_4_ = 0.16666666;
      auVar24._4_4_ = 0.16666666;
      auVar24._16_4_ = 0.16666666;
      auVar24._20_4_ = 0.16666666;
      auVar24._24_4_ = 0.16666666;
      auVar24._28_4_ = 0.16666666;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar24);
      auVar25._8_4_ = 0.5;
      auVar25._12_4_ = 0.5;
      auVar25._0_4_ = 0.5;
      auVar25._4_4_ = 0.5;
      auVar25._16_4_ = 0.5;
      auVar25._20_4_ = 0.5;
      auVar25._24_4_ = 0.5;
      auVar25._28_4_ = 0.5;
      auVar4 = vfmadd213ps_fma(auVar121,ZEXT1632(auVar4),auVar25);
      auVar4 = vfmadd213ps_fma(_local_3760,ZEXT1632(auVar4),auVar121);
      local_3700 = auVar4._0_4_;
      fStack_36fc = auVar4._4_4_;
      fStack_36f8 = auVar4._8_4_;
      fStack_36f4 = auVar4._12_4_;
      local_2f00 = auVar6._0_4_;
      fStack_2efc = auVar6._4_4_;
      fStack_2ef8 = auVar6._8_4_;
      fStack_2ef4 = auVar6._12_4_;
      fStack_2ef0 = auVar6._16_4_;
      fStack_2eec = auVar6._20_4_;
      fStack_2ee8 = auVar6._24_4_;
      fStack_2ee4 = auVar6._28_4_;
      local_37a0 = CONCAT44((int)fStack_2efc,(int)local_2f00);
      uStack_3798 = CONCAT44((int)fStack_2ef4,(int)fStack_2ef8);
      uStack_3790 = CONCAT44((int)fStack_2eec,(int)fStack_2ef0);
      uStack_3788 = CONCAT44((int)fStack_2ee4,(int)fStack_2ee8);
      auVar42._8_8_ = uStack_3798;
      auVar42._0_8_ = local_37a0;
      auVar41._8_8_ = 0x7f0000007f;
      auVar41._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar42,auVar41);
      auVar40._8_8_ = uStack_3788;
      auVar40._0_8_ = uStack_3790;
      auVar39._8_8_ = 0x7f0000007f;
      auVar39._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar40,auVar39);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_36a0 = auVar4._0_4_;
      fStack_369c = auVar4._4_4_;
      fStack_3698 = auVar4._8_4_;
      fStack_3694 = auVar4._12_4_;
      fStack_3690 = auVar5._0_4_;
      fStack_368c = auVar5._4_4_;
      fStack_3688 = auVar5._8_4_;
      local_3800._4_4_ = (fStack_36fc + 1.0) * fStack_369c;
      local_3800._0_4_ = (local_3700 + 1.0) * local_36a0;
      uStack_37f8._0_4_ = (fStack_36f8 + 1.0) * fStack_3698;
      uStack_37f8._4_4_ = (fStack_36f4 + 1.0) * fStack_3694;
      uStack_37f0._0_4_ = fStack_3690 * 1.0;
      uStack_37f0._4_4_ = fStack_368c * 1.0;
      auVar119 = _local_3800;
      uStack_37e8._0_4_ = fStack_3688 * 1.0;
      uStack_37e8._4_4_ = 0x3f800000;
      auVar6 = _local_3800;
      uStack_37f0 = auVar119._16_8_;
      uStack_37e8 = auVar6._24_8_;
      *local_3a48 = local_3800;
      local_3a48[1] = uStack_37f8;
      local_3a48[2] = uStack_37f0;
      local_3a48[3] = uStack_37e8;
      local_3a38 = local_3a38 + 4;
      local_3a40 = local_3a40 + 2;
      local_3a48 = local_3a48 + 4;
    }
    for (; local_3ac4 < in_ECX; local_3ac4 = local_3ac4 + 1) {
      uVar1 = *local_3a40;
      auVar111._8_8_ = CONCAT44(uVar1,uVar1);
      auVar111._0_8_ = CONCAT44(uVar1,uVar1);
      auVar110._8_8_ = CONCAT44(uVar1,uVar1);
      auVar110._0_8_ = CONCAT44(uVar1,uVar1);
      auVar4 = vcmpps_avx(auVar111,ZEXT816(0),2);
      auVar83._8_8_ = 0x80000000800000;
      auVar83._0_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(auVar110,auVar83);
      auVar9 = vpsrld_avx(auVar5,ZEXT416(0x17));
      auVar88._8_8_ = 0x807fffff807fffff;
      auVar88._0_8_ = 0x807fffff807fffff;
      auVar5 = vpand_avx(auVar5,auVar88);
      auVar108._8_8_ = 0x3f0000003f000000;
      auVar108._0_8_ = 0x3f0000003f000000;
      auVar8 = vpor_avx(auVar5,auVar108);
      auVar84._8_8_ = 0x7f0000007f;
      auVar84._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar9,auVar84);
      auVar5 = vcvtdq2ps_avx(auVar5);
      local_840 = auVar5._0_4_;
      fStack_83c = auVar5._4_4_;
      fStack_838 = auVar5._8_4_;
      fStack_834 = auVar5._12_4_;
      local_8e0 = CONCAT44(fStack_83c + 1.0,local_840 + 1.0);
      uStack_8d8._0_4_ = fStack_838 + 1.0;
      uStack_8d8._4_4_ = fStack_834 + 1.0;
      auVar109._8_8_ = 0x3f3504f33f3504f3;
      auVar109._0_8_ = 0x3f3504f33f3504f3;
      auVar5 = vcmpps_avx(auVar8,auVar109,1);
      auVar9 = vpand_avx(auVar8,auVar5);
      auVar82._8_8_ = 0x3f8000003f800000;
      auVar82._0_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar82);
      auVar87._8_8_ = 0x3f8000003f800000;
      auVar87._0_8_ = 0x3f8000003f800000;
      auVar5 = vpand_avx(auVar87,auVar5);
      auVar81._8_8_ = uStack_8d8;
      auVar81._0_8_ = local_8e0;
      auVar5 = vsubps_avx(auVar81,auVar5);
      local_860 = auVar8._0_4_;
      fStack_85c = auVar8._4_4_;
      fStack_858 = auVar8._8_4_;
      fStack_854 = auVar8._12_4_;
      local_870 = auVar9._0_4_;
      fStack_86c = auVar9._4_4_;
      fStack_868 = auVar9._8_4_;
      fStack_864 = auVar9._12_4_;
      local_8a0._0_4_ = local_860 + local_870;
      local_8a0._4_4_ = fStack_85c + fStack_86c;
      fStack_898 = fStack_858 + fStack_868;
      fStack_894 = fStack_854 + fStack_864;
      uStack_918 = 0x3d9021bb3d9021bb;
      local_920 = (undefined1  [8])0x3d9021bb3d9021bb;
      auVar98._8_4_ = -0.1151461;
      auVar98._12_4_ = -0.1151461;
      auVar98._0_4_ = -0.1151461;
      auVar98._4_4_ = -0.1151461;
      auVar9 = vfmadd213ps_fma(_local_8a0,_local_920,auVar98);
      auVar99._8_4_ = 0.116769984;
      auVar99._12_4_ = 0.116769984;
      auVar99._0_4_ = 0.116769984;
      auVar99._4_4_ = 0.116769984;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar99);
      auVar100._8_4_ = -0.12420141;
      auVar100._12_4_ = -0.12420141;
      auVar100._0_4_ = -0.12420141;
      auVar100._4_4_ = -0.12420141;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar100);
      auVar101._8_4_ = 0.14249323;
      auVar101._12_4_ = 0.14249323;
      auVar101._0_4_ = 0.14249323;
      auVar101._4_4_ = 0.14249323;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar101);
      auVar102._8_4_ = -0.16668057;
      auVar102._12_4_ = -0.16668057;
      auVar102._0_4_ = -0.16668057;
      auVar102._4_4_ = -0.16668057;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar102);
      auVar103._8_4_ = 0.20000714;
      auVar103._12_4_ = 0.20000714;
      auVar103._0_4_ = 0.20000714;
      auVar103._4_4_ = 0.20000714;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar103);
      auVar104._8_4_ = -0.24999994;
      auVar104._12_4_ = -0.24999994;
      auVar104._0_4_ = -0.24999994;
      auVar104._4_4_ = -0.24999994;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar104);
      auVar105._8_4_ = 0.3333333;
      auVar105._12_4_ = 0.3333333;
      auVar105._0_4_ = 0.3333333;
      auVar105._4_4_ = 0.3333333;
      auVar9 = vfmadd213ps_fma(_local_8a0,auVar9,auVar105);
      local_7c0 = auVar9._0_4_;
      fStack_7bc = auVar9._4_4_;
      fStack_7b8 = auVar9._8_4_;
      fStack_7b4 = auVar9._12_4_;
      local_920._4_4_ =
           fStack_7bc * (float)local_8a0._4_4_ * (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
      local_920._0_4_ =
           local_7c0 * (float)local_8a0._0_4_ * (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
      uStack_918._0_4_ = fStack_7b8 * fStack_898 * fStack_898 * fStack_898;
      uStack_918._4_4_ = fStack_7b4 * fStack_894 * fStack_894 * fStack_894;
      auVar106._8_4_ = -0.00021219444;
      auVar106._12_4_ = -0.00021219444;
      auVar106._0_4_ = -0.00021219444;
      auVar106._4_4_ = -0.00021219444;
      auVar9 = vfmadd213ps_fma(auVar106,auVar5,_local_920);
      auVar118._4_4_ = (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
      auVar118._0_4_ = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
      auVar118._8_4_ = fStack_898 * fStack_898;
      auVar118._12_4_ = fStack_894 * fStack_894;
      auVar92._8_4_ = 0.5;
      auVar92._12_4_ = 0.5;
      auVar92._0_4_ = 0.5;
      auVar92._4_4_ = 0.5;
      auVar9 = vfnmadd213ps_fma(auVar92,auVar118,auVar9);
      local_890 = auVar9._0_4_;
      fStack_88c = auVar9._4_4_;
      fStack_888 = auVar9._8_4_;
      fStack_884 = auVar9._12_4_;
      local_8a0._4_4_ = (float)local_8a0._4_4_ + fStack_88c;
      local_8a0._0_4_ = (float)local_8a0._0_4_ + local_890;
      fStack_898 = fStack_898 + fStack_888;
      fStack_894 = fStack_894 + fStack_884;
      auVar107._8_4_ = 0.6933594;
      auVar107._12_4_ = 0.6933594;
      auVar107._0_4_ = 0.6933594;
      auVar107._4_4_ = 0.6933594;
      auVar5 = vfmadd213ps_fma(auVar107,auVar5,_local_8a0);
      auVar4 = vpor_avx(auVar5,auVar4);
      local_af0 = (float)*local_3a38;
      fStack_aec = (float)((ulong)*local_3a38 >> 0x20);
      fStack_ae8 = (float)local_3a38[1];
      fStack_ae4 = (float)((ulong)local_3a38[1] >> 0x20);
      local_b00 = auVar4._0_4_;
      fStack_afc = auVar4._4_4_;
      fStack_af8 = auVar4._8_4_;
      fStack_af4 = auVar4._12_4_;
      local_a70 = CONCAT44(fStack_aec * fStack_afc,local_af0 * local_b00);
      uStack_a68._0_4_ = fStack_ae8 * fStack_af8;
      uStack_a68._4_4_ = fStack_ae4 * fStack_af4;
      auVar78._8_8_ = uStack_a68;
      auVar78._0_8_ = local_a70;
      auVar77._8_8_ = 0x42b0c0a542b0c0a5;
      auVar77._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(auVar78,auVar77);
      auVar76._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9 = vmaxps_avx(auVar4,auVar76);
      local_9b0 = auVar9._0_4_;
      fStack_9ac = auVar9._4_4_;
      fStack_9a8 = auVar9._8_4_;
      fStack_9a4 = auVar9._12_4_;
      fVar120 = local_9b0 * 1.442695 + 0.5;
      fVar122 = fStack_9ac * 1.442695 + 0.5;
      fVar123 = fStack_9a8 * 1.442695 + 0.5;
      fVar124 = fStack_9a4 * 1.442695 + 0.5;
      local_a90 = CONCAT44(fVar122,fVar120);
      uStack_a88._0_4_ = fVar123;
      uStack_a88._4_4_ = fVar124;
      local_aa0 = CONCAT44((int)fVar122,(int)fVar120);
      uStack_a98._0_4_ = (int)fVar123;
      uStack_a98._4_4_ = (int)fVar124;
      auVar85._8_8_ = uStack_a98;
      auVar85._0_8_ = local_aa0;
      auVar5 = vcvtdq2ps_avx(auVar85);
      auVar86._8_8_ = uStack_a88;
      auVar86._0_8_ = local_a90;
      auVar4 = vcmpps_avx(auVar86,auVar5,1);
      auVar89._8_8_ = 0x3f8000003f800000;
      auVar89._0_8_ = 0x3f8000003f800000;
      auVar4 = vpand_avx(auVar4,auVar89);
      auVar4 = vsubps_avx(auVar5,auVar4);
      auVar90._8_4_ = 0.6933594;
      auVar90._12_4_ = 0.6933594;
      auVar90._0_4_ = 0.6933594;
      auVar90._4_4_ = 0.6933594;
      auVar5 = vfnmadd213ps_fma(auVar90,auVar4,auVar9);
      auVar91._8_4_ = -0.00021219444;
      auVar91._12_4_ = -0.00021219444;
      auVar91._0_4_ = -0.00021219444;
      auVar91._4_4_ = -0.00021219444;
      auVar9 = vfnmadd213ps_fma(auVar91,auVar4,auVar5);
      local_9d0 = auVar9._0_4_;
      fStack_9cc = auVar9._4_4_;
      fStack_9c8 = auVar9._8_4_;
      fStack_9c4 = auVar9._12_4_;
      local_a80._4_4_ = fStack_9cc * fStack_9cc;
      local_a80._0_4_ = local_9d0 * local_9d0;
      fStack_a78 = fStack_9c8 * fStack_9c8;
      fStack_a74 = fStack_9c4 * fStack_9c4;
      uStack_ac8 = 0x3950696739506967;
      local_ad0 = (undefined1  [8])0x3950696739506967;
      auVar93._8_4_ = 0.0013981999;
      auVar93._12_4_ = 0.0013981999;
      auVar93._0_4_ = 0.0013981999;
      auVar93._4_4_ = 0.0013981999;
      auVar5 = vfmadd213ps_fma(auVar9,_local_ad0,auVar93);
      auVar94._8_4_ = 0.008333452;
      auVar94._12_4_ = 0.008333452;
      auVar94._0_4_ = 0.008333452;
      auVar94._4_4_ = 0.008333452;
      auVar5 = vfmadd213ps_fma(auVar9,auVar5,auVar94);
      auVar95._8_4_ = 0.041665796;
      auVar95._12_4_ = 0.041665796;
      auVar95._0_4_ = 0.041665796;
      auVar95._4_4_ = 0.041665796;
      auVar5 = vfmadd213ps_fma(auVar9,auVar5,auVar95);
      auVar96._8_4_ = 0.16666666;
      auVar96._12_4_ = 0.16666666;
      auVar96._0_4_ = 0.16666666;
      auVar96._4_4_ = 0.16666666;
      auVar5 = vfmadd213ps_fma(auVar9,auVar5,auVar96);
      auVar97._8_4_ = 0.5;
      auVar97._12_4_ = 0.5;
      auVar97._0_4_ = 0.5;
      auVar97._4_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar9,auVar5,auVar97);
      auVar5 = vfmadd213ps_fma(_local_a80,auVar5,auVar9);
      local_a50 = auVar5._0_4_;
      fStack_a4c = auVar5._4_4_;
      fStack_a48 = auVar5._8_4_;
      fStack_a44 = auVar5._12_4_;
      local_710 = auVar4._0_4_;
      fStack_70c = auVar4._4_4_;
      fStack_708 = auVar4._8_4_;
      fStack_704 = auVar4._12_4_;
      local_aa0 = CONCAT44((int)fStack_70c,(int)local_710);
      uStack_a98._0_4_ = (int)fStack_708;
      uStack_a98._4_4_ = (int)fStack_704;
      auVar80._8_8_ = uStack_a98;
      auVar80._0_8_ = local_aa0;
      auVar79._8_8_ = 0x7f0000007f;
      auVar79._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar80,auVar79);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      local_a00 = auVar4._0_4_;
      fStack_9fc = auVar4._4_4_;
      fStack_9f8 = auVar4._8_4_;
      fStack_9f4 = auVar4._12_4_;
      local_ad0._4_4_ = (fStack_a4c + 1.0) * fStack_9fc;
      local_ad0._0_4_ = (local_a50 + 1.0) * local_a00;
      uStack_ac8._0_4_ = (fStack_a48 + 1.0) * fStack_9f8;
      uStack_ac8._4_4_ = (fStack_a44 + 1.0) * fStack_9f4;
      *local_3a48 = local_ad0;
      local_3a48[1] = uStack_ac8;
      local_3a38 = local_3a38 + 2;
      local_3a40 = local_3a40 + 1;
      local_3a48 = local_3a48 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}